

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O2

string * __thiscall
snestistics::AnnotationResolver::data_label
          (string *__return_storage_ptr__,AnnotationResolver *this,Pointer p,string *use_comment,
          bool force)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string l;
  char t [7];
  allocator local_49;
  string local_48;
  char local_27 [7];
  
  if ((use_comment != (string *)0x0) && (use_comment->_M_string_length != 0)) {
    __assert_fail("!use_comment || use_comment->empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/annotations.cpp"
                  ,0x231,
                  "std::string snestistics::AnnotationResolver::data_label(const Pointer, std::string *, const bool) const"
                 );
  }
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  line_info(this,p,&local_48,(string *)0x0,use_comment,false);
  if (local_48._M_string_length == 0 && force) {
    sprintf(local_27,"data_%0X",(ulong)p);
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_27,&local_49);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,local_48.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_48.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_48._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,local_48.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_48._M_string_length;
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)paVar1;
  }
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string AnnotationResolver::data_label(const Pointer p, std::string * use_comment, const bool force) const {
	assert(!use_comment || use_comment->empty());
	std::string l;
	line_info(p, &l, nullptr, use_comment, false);
	if (!l.empty() || !force)
		return l;
	char t[7];
	sprintf(t, "data_%0X", p);
	return std::string(t);
}